

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

string * __thiscall
t_php_generator::declare_field_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_field *tfield,bool init,bool obj)

{
  int iVar1;
  t_type *ptVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  t_base_type *this_00;
  undefined1 auVar3 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  string result;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&result,"$",&tfield->name_);
  if ((int)CONCAT71(in_register_00000009,init) != 0) {
    ptVar2 = t_type::get_true_type(tfield->type_);
    iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])(ptVar2);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])(ptVar2);
      if (((char)iVar1 == '\0') &&
         (iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xd])(ptVar2), (char)iVar1 == '\0')) {
        iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xb])(ptVar2);
        if (((char)iVar1 == '\0') &&
           (iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xc])(ptVar2), (char)iVar1 == '\0'))
        goto switchD_0027d2e2_caseD_0;
        if (obj) {
          php_namespace_abi_cxx11_(&local_88,this,ptVar2->program_);
          std::operator+(&local_68," = new ",&local_88);
          iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[3])(ptVar2);
          std::operator+(&local_48,&local_68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var,iVar1));
          std::operator+(&bStack_c8,&local_48,"()");
          std::__cxx11::string::append((string *)&result);
          std::__cxx11::string::~string((string *)&bStack_c8);
          std::__cxx11::string::~string((string *)&local_48);
          std::__cxx11::string::~string((string *)&local_68);
          std::__cxx11::string::~string((string *)&local_88);
          goto switchD_0027d2e2_caseD_0;
        }
      }
      std::__cxx11::string::append((char *)&result);
    }
    else {
      this_00 = (t_base_type *)(ulong)*(uint *)&ptVar2[1].super_t_doc._vptr_t_doc;
      switch(this_00) {
      case (t_base_type *)0x0:
        goto switchD_0027d2e2_caseD_0;
      case (t_base_type *)0x1:
        break;
      case (t_base_type *)0x2:
        break;
      case (t_base_type *)0x3:
      case (t_base_type *)0x4:
      case (t_base_type *)0x5:
      case (t_base_type *)0x6:
        break;
      case (t_base_type *)0x7:
        break;
      default:
        auVar3 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&bStack_c8,this_00,auVar3._8_4_);
        std::operator+(auVar3._0_8_,"compiler error: no PHP initializer for base type ",&bStack_c8);
        __cxa_throw(auVar3._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      std::__cxx11::string::append((char *)&result);
    }
  }
switchD_0027d2e2_caseD_0:
  std::operator+(__return_storage_ptr__,&result,";");
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

string t_php_generator::declare_field(t_field* tfield, bool init, bool obj) {
  string result = "$" + tfield->get_name();
  if (init) {
    t_type* type = get_true_type(tfield->get_type());
    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        break;
      case t_base_type::TYPE_STRING:
        result += " = ''";
        break;
      case t_base_type::TYPE_BOOL:
        result += " = false";
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
        result += " = 0";
        break;
      case t_base_type::TYPE_DOUBLE:
        result += " = 0.0";
        break;
      default:
        throw "compiler error: no PHP initializer for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      result += " = 0";
    } else if (type->is_container()) {
      result += " = array()";
    } else if (type->is_struct() || type->is_xception()) {
      if (obj) {
        result += " = new " + php_namespace(type->get_program()) + type->get_name() + "()";
      } else {
        result += " = null";
      }
    }
  }
  return result + ";";
}